

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

char * build_pathname(archive_string *as,file_info *file)

{
  archive_string *in_RSI;
  undefined8 *in_RDI;
  file_info *in_stack_ffffffffffffffe8;
  
  if ((in_RSI->length != 0) && (*(long *)(in_RSI->length + 0xb0) != 0)) {
    build_pathname(in_RSI,in_stack_ffffffffffffffe8);
    archive_strcat(in_RSI,in_stack_ffffffffffffffe8);
  }
  if (in_RSI[7].length == 0) {
    archive_strcat(in_RSI,in_stack_ffffffffffffffe8);
  }
  else {
    archive_string_concat(in_RSI,(archive_string *)in_stack_ffffffffffffffe8);
  }
  return (char *)*in_RDI;
}

Assistant:

static const char *
build_pathname(struct archive_string *as, struct file_info *file)
{
	if (file->parent != NULL && archive_strlen(&file->parent->name) > 0) {
		build_pathname(as, file->parent);
		archive_strcat(as, "/");
	}
	if (archive_strlen(&file->name) == 0)
		archive_strcat(as, ".");
	else
		archive_string_concat(as, &file->name);
	return (as->s);
}